

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRandom.h
# Opt level: O2

double __thiscall HighsRandom::closedFraction(HighsRandom *this)

{
  ulong uVar1;
  ulong uVar2;
  
  advance(this);
  uVar2 = this->state & 0xffffffff;
  uVar1 = this->state >> 0x20;
  return (double)((uVar1 + 0x8a183895eeac1536) * (uVar2 + 0x42d8680e260ae5b) >> 0x20 ^
                 (uVar1 + 0x80c8963be3e4c2f3) * (uVar2 + 0xc8497d2a400d9551) >> 0xb) *
         1.1102230246251565e-16;
}

Assistant:

double closedFraction() {
    advance();
    // 53 bit result is in interval [0,2^53-1]
    uint64_t output = (HighsHashHelpers::pair_hash<0>(
                           static_cast<uint32_t>(state), state >> 32) >>
                       (64 - 53)) ^
                      (HighsHashHelpers::pair_hash<1>(
                           static_cast<uint32_t>(state), state >> 32) >>
                       32);
    // compute output / (2^53-1) in double precision which is in the closed
    // interval [0,1]
    return static_cast<double>(output) * 1.1102230246251566e-16;
  }